

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat-types.h
# Opt level: O3

Clause * __thiscall SAT::getConfl(SAT *this,Reason *r,Lit p)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined4 extraout_var;
  Clause *pCVar2;
  uint uVar3;
  
  pCVar2 = (Clause *)(r->field_0)._a;
  uVar3 = (uint)pCVar2 & 3;
  if (((ulong)pCVar2 & 3) != 0) {
    if (uVar3 == 1) {
      UNRECOVERED_JUMPTABLE = engine.propagators.data[(ulong)pCVar2 >> 0x20]->_vptr_Propagator[5];
      iVar1 = (*UNRECOVERED_JUMPTABLE)
                        (engine.propagators.data[(ulong)pCVar2 >> 0x20],(ulong)(uint)p.x,
                         (ulong)((uint)pCVar2 >> 2),UNRECOVERED_JUMPTABLE);
      return (Clause *)CONCAT44(extraout_var,iVar1);
    }
    pCVar2 = this->short_expl;
    *(uint *)pCVar2 = uVar3 << 8 | (uint)*(byte *)pCVar2;
    *(uint *)(pCVar2 + 1) = *(uint *)&r->field_0 >> 2;
    if (uVar3 == 3) {
      pCVar2[1].data[0].x = *(int *)((long)&r->field_0 + 4);
    }
    pCVar2 = this->short_expl;
  }
  return pCVar2;
}

Assistant:

unsigned int d1() const {
		assert(type() != 0);
		return static_cast<unsigned int>((_a & 0xFFFFFFFF) >> 2);
	}